

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict sexp_translate_opcode_type(sexp_conflict ctx,sexp_conflict type)

{
  undefined1 auVar1 [16];
  sexp_conflict in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  sexp_conflict *local_28;
  undefined8 local_20;
  sexp_conflict local_18;
  sexp_conflict local_10;
  long local_8;
  
  local_18 = (sexp_conflict)0x43e;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_28,0,0x10);
  local_30 = 0x43e;
  memset(&local_40,0,0x10);
  local_18 = local_10;
  if (local_10 == (sexp_conflict)0x0) {
    local_18 = *(sexp_conflict *)(*(long *)(*(long *)(local_8 + 0x28) + 0x20) + 0x10);
  }
  if (((ulong)local_18 & 1) == 1) {
    auVar1._8_8_ = (long)local_18 >> 0x3f;
    auVar1._0_8_ = (ulong)local_18 & 0xfffffffffffffffe;
    local_18 = *(sexp_conflict *)
                (*(long *)(*(long *)(local_8 + 0x28) + 0x20) + 0x10 +
                SUB168(auVar1 / SEXT816(2),0) * 8);
  }
  else if (local_18 == (sexp_conflict)0x23e) {
    local_28 = &local_18;
    local_20 = *(undefined8 *)(local_8 + 0x6080);
    *(sexp_conflict ***)(local_8 + 0x6080) = &local_28;
    local_40 = &local_30;
    local_38 = *(undefined8 *)(local_8 + 0x6080);
    *(undefined8 ***)(local_8 + 0x6080) = &local_40;
    local_30 = sexp_intern(local_8,"or",0xffffffffffffffff);
    local_18 = (sexp_conflict)sexp_cons_op(local_8,0,2,0x23e);
    local_18 = (sexp_conflict)
               sexp_cons_op(local_8,0,2,
                            *(undefined8 *)(*(long *)(*(long *)(local_8 + 0x28) + 0x20) + 0x40),
                            local_18);
    local_18 = (sexp_conflict)sexp_cons_op(local_8,0,2,local_30,local_18);
    *(undefined8 *)(local_8 + 0x6080) = local_20;
  }
  return local_18;
}

Assistant:

static sexp sexp_translate_opcode_type (sexp ctx, sexp type) {
  sexp_gc_var2(res, tmp);
  res = type;
  if (! res) {
    res = sexp_type_by_index(ctx, SEXP_OBJECT);
  } if (sexp_fixnump(res)) {
    res = sexp_type_by_index(ctx, sexp_unbox_fixnum(res));
  } else if (sexp_nullp(res)) {        /* opcode list types */
    sexp_gc_preserve2(ctx, res, tmp);
    tmp = sexp_intern(ctx, "or", -1);
    res = sexp_cons(ctx, SEXP_NULL, SEXP_NULL);
    res = sexp_cons(ctx, sexp_type_by_index(ctx, SEXP_PAIR), res);
    res = sexp_cons(ctx, tmp, res);
    sexp_gc_release2(ctx);
  }
  return res;
}